

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# h265e_slice.c
# Opt level: O1

RK_S32 h265e_code_slice_skip_frame(void *ctx,H265eSlice *slice,RK_U8 *buf,RK_S32 len)

{
  ulong uVar1;
  int iVar2;
  uint uVar3;
  RK_U32 RVar4;
  RK_U32 RVar5;
  RK_S32 RVar6;
  ulong uVar7;
  ulong uVar8;
  TileInfo tile;
  MppWriteCtx bitIf;
  TileInfo local_78;
  MppWriteCtx local_60;
  
  if (((byte)h265e_debug & 1) != 0) {
    _mpp_log_l(4,"h265e_slice","enter\n","h265e_code_slice_skip_frame");
  }
  if (buf == (RK_U8 *)0x0 || len == 0) {
    _mpp_log_l(2,"h265e_slice","buf or size no set",(char *)0x0);
    RVar6 = -1;
  }
  else {
    mpp_writer_init(&local_60,buf,len);
    local_78.ctu_addr = 0;
    local_78.tile_start_y = 0;
    local_78.tile_end_y = *(int *)((long)ctx + 0x1658) - 1;
    if (*(int *)((long)ctx + 0x4d3c) == 0) {
      uVar3 = *(uint *)((long)ctx + 0x1664);
      local_78.tile_end_x = *(int *)((long)ctx + 0x1654) - 1;
      local_78.mb_total =
           (((*(int *)((long)ctx + 0x1658) + uVar3) - 1) / uVar3) *
           (((*(int *)((long)ctx + 0x1654) + uVar3) - 1) / uVar3);
      local_78.tile_start_x = 0;
      h265e_code_skip_tile(ctx,slice,&local_60,&local_78);
    }
    else {
      local_78.tile_start_x = 0;
      uVar7 = (ulong)*(uint *)((long)ctx + 0x4d3c);
      if (-1 < (int)*(uint *)((long)ctx + 0x4d3c)) {
        uVar8 = 0xffffffffffffffff;
        do {
          RVar5 = local_78.ctu_addr;
          RVar4 = local_78.tile_start_x;
          uVar1 = uVar8 + 1;
          iVar2 = *(int *)((long)ctx + uVar8 * 4 + 0x4d44);
          local_78.mb_total = *(int *)((long)ctx + uVar8 * 4 + 0x4dcc) * iVar2;
          if (uVar1 == (uVar7 & 0xffffffff)) {
            iVar2 = *(int *)((long)ctx + 0x1654);
          }
          else {
            iVar2 = iVar2 * *(int *)((long)ctx + 0x1664) + local_78.tile_start_x;
          }
          local_78.tile_end_x = iVar2 - 1;
          h265e_code_skip_tile(ctx,slice,&local_60,&local_78);
          iVar2 = *(int *)((long)ctx + uVar8 * 4 + 0x4d44);
          local_78.tile_start_x = RVar4 + *(int *)((long)ctx + 0x1664) * iVar2;
          local_78.ctu_addr = RVar5 + iVar2;
          uVar7 = (ulong)*(int *)((long)ctx + 0x4d3c);
          uVar8 = uVar1;
        } while ((long)uVar1 < (long)uVar7);
      }
    }
    if (((byte)h265e_debug & 1) != 0) {
      _mpp_log_l(4,"h265e_slice","leave\n","h265e_code_slice_skip_frame");
    }
    RVar6 = mpp_writer_bytes(&local_60);
  }
  return RVar6;
}

Assistant:

RK_S32 h265e_code_slice_skip_frame(void *ctx, H265eSlice *slice, RK_U8 *buf, RK_S32 len)
{
    H265eCtx *p = (H265eCtx *)ctx;
    H265eSps *sps = &p->sps;
    H265ePps *pps = &p->pps;
    TileInfo tile;
    MppWriteCtx bitIf;
    RK_U32 mb_wd;
    RK_U32 mb_h;
    RK_S32 i;

    h265e_dbg_func("enter\n");
    if (!buf || !len) {
        mpp_err("buf or size no set");
        return MPP_NOK;
    }

    mpp_writer_init(&bitIf, buf, len);
    tile.ctu_addr = 0;
    tile.tile_start_y = 0;
    tile.tile_end_y = sps->m_picHeightInLumaSamples - 1;

    if (pps->m_nNumTileColumnsMinus1) {
        tile.tile_start_x = 0;
        for (i = 0; i <= pps->m_nNumTileColumnsMinus1; i++) {
            tile.mb_total = pps->m_nTileColumnWidthArray[i] * pps->m_nTileRowHeightArray[i];
            if (i != pps->m_nNumTileColumnsMinus1)
                tile.tile_end_x = tile.tile_start_x +
                                  (pps->m_nTileColumnWidthArray[i] * sps->m_maxCUSize) - 1;
            else
                tile.tile_end_x = sps->m_picWidthInLumaSamples - 1;
            h265e_code_skip_tile(ctx, slice, &bitIf, &tile);
            tile.tile_start_x += (pps->m_nTileColumnWidthArray[i] * sps->m_maxCUSize);
            tile.ctu_addr += pps->m_nTileColumnWidthArray[i];
        }
    } else {
        mb_wd = (sps->m_picWidthInLumaSamples + sps->m_maxCUSize - 1) / sps->m_maxCUSize;
        mb_h = (sps->m_picHeightInLumaSamples + sps->m_maxCUSize - 1) / sps->m_maxCUSize;
        tile.mb_total = mb_wd * mb_h;
        tile.tile_start_x = 0;
        tile.tile_end_x = sps->m_picWidthInLumaSamples - 1;
        h265e_code_skip_tile(ctx, slice, &bitIf, &tile);
    }

    h265e_dbg_func("leave\n");
    return mpp_writer_bytes(&bitIf);
}